

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateRepeatedPrimitiveHelperMethods
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field,
          bool untyped)

{
  long lVar1;
  string *value1;
  FieldDescriptor *field_00;
  char *pcVar2;
  BytesMode bytes_mode;
  undefined7 in_register_00000081;
  undefined1 in_R9B;
  char *pcVar3;
  allocator local_d3;
  allocator local_d2;
  allocator local_d1;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bytes_mode = (BytesMode)CONCAT71(in_register_00000081,untyped);
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_90,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x58),
             (Descriptor *)field);
  (anonymous_namespace)::JSGetterName_abi_cxx11_
            (&local_b0,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,(FieldDescriptor *)0x1
             ,bytes_mode,(bool)in_R9B);
  (anonymous_namespace)::JSTypeName_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
             (FieldDescriptor *)0x0,bytes_mode);
  (anonymous_namespace)::JSFieldIndex_abi_cxx11_(&local_d0,(_anonymous_namespace_ *)field,field_00);
  value1 = &local_90;
  io::Printer::Print(printer,
                     "/**\n * @param {!$optionaltype$} value\n * @param {number=} opt_index\n */\n$class$.prototype.add$name$ = function(value, opt_index) {\n  jspb.Message.addToRepeatedField(this, $index$"
                     ,"class",value1,"name",&local_b0,"optionaltype",&local_70,"index",&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  pcVar2 = "/** @type{string|number|boolean|!Uint8Array} */(";
  pcVar3 = "";
  if (!untyped) {
    pcVar2 = "";
  }
  std::__cxx11::string::string((string *)&local_90,pcVar2,&local_d1);
  if (untyped) {
    pcVar3 = ")";
  }
  std::__cxx11::string::string((string *)&local_b0,pcVar3,&local_d2);
  lVar1 = *(long *)(field + 0x60);
  if (lVar1 == 0) {
    std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_d0);
  }
  else {
    (anonymous_namespace)::JSOneofArray_abi_cxx11_
              (&local_d0,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)value1);
    std::operator+(&local_70,", ",&local_d0);
  }
  std::__cxx11::string::string((string *)&local_50,"",&local_d3);
  io::Printer::Print(printer,
                     "$oneofgroup$, $type$value$rptvalueinit$$typeclose$, opt_index);\n};\n\n\n",
                     "type",&local_90,"typeclose",&local_b0,"oneofgroup",&local_70,"rptvalueinit",
                     &local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  if (lVar1 != 0) {
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void Generator::GenerateRepeatedPrimitiveHelperMethods(
    const GeneratorOptions& options, io::Printer* printer,
    const FieldDescriptor* field, bool untyped) const {
  printer->Print(
      "/**\n"
      " * @param {!$optionaltype$} value\n"
      " * @param {number=} opt_index\n"
      " */\n"
      "$class$.prototype.add$name$ = function(value, opt_index) {\n"
      "  jspb.Message.addToRepeatedField(this, $index$",
      "class", GetMessagePath(options, field->containing_type()),
      "name", JSGetterName(options, field, BYTES_DEFAULT,
                   /* drop_list = */ true),
      "optionaltype", JSTypeName(options, field, BYTES_DEFAULT), "index",
      JSFieldIndex(field));
  printer->Print(
      "$oneofgroup$, $type$value$rptvalueinit$$typeclose$, opt_index);\n"
      "};\n"
      "\n"
      "\n",
      "type", untyped ? "/** @type{string|number|boolean|!Uint8Array} */(" : "",
      "typeclose", untyped ? ")" : "", "oneofgroup",
      (field->containing_oneof() ? (", " + JSOneofArray(options, field)) : ""),
      "rptvalueinit", "");
}